

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O3

LocationIndex __thiscall wasm::anon_unknown_237::Flower::getIndex(Flower *this,Location *location)

{
  pointer *ppLVar1;
  undefined8 *puVar2;
  pointer pLVar3;
  pointer puVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  Flower *pFVar9;
  pointer pLVar10;
  iterator iVar11;
  mapped_type *pmVar12;
  long lVar13;
  pointer pLVar14;
  ulong uVar15;
  pointer pLVar16;
  _Map_base<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_std::pair<const_std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_unsigned_int>,_std::allocator<std::pair<const_std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>_>,_std::hash<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *this_00;
  long lVar17;
  pointer pLVar19;
  Fatal local_1f0;
  Flower *local_68;
  _Map_base<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_std::pair<const_std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_unsigned_int>,_std::allocator<std::pair<const_std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>_>,_std::hash<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_60;
  key_type *local_58;
  void *local_50;
  long local_48;
  pointer local_40;
  pointer local_38;
  ulong uVar18;
  
  this_00 = (_Map_base<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_std::pair<const_std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_unsigned_int>,_std::allocator<std::pair<const_std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>_>,_std::hash<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             *)&this->locationIndexes;
  iVar11 = std::
           _Hashtable<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_std::pair<const_std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_unsigned_int>,_std::allocator<std::pair<const_std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>_>,_std::hash<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::find((_Hashtable<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_std::pair<const_std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_unsigned_int>,_std::allocator<std::pair<const_std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>_>,_std::hash<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)this_00,location);
  if (iVar11.
      super__Node_iterator_base<std::pair<const_std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_unsigned_int>,_true>
      ._M_cur == (__node_type *)0x0) {
    pLVar16 = (this->locations).
              super__Vector_base<wasm::(anonymous_namespace)::Flower::LocationInfo,_std::allocator<wasm::(anonymous_namespace)::Flower::LocationInfo>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pLVar3 = (this->locations).
             super__Vector_base<wasm::(anonymous_namespace)::Flower::LocationInfo,_std::allocator<wasm::(anonymous_namespace)::Flower::LocationInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar13 = (long)pLVar3 - (long)pLVar16 >> 5;
    uVar15 = lVar13 * -0x5555555555555555;
    if (0xfffffffe < uVar15) {
      Fatal::Fatal(&local_1f0);
      Fatal::operator<<(&local_1f0,(char (*) [31])"Too many locations for 32 bits");
      Fatal::~Fatal(&local_1f0);
    }
    if (pLVar3 == (this->locations).
                  super__Vector_base<wasm::(anonymous_namespace)::Flower::LocationInfo,_std::allocator<wasm::(anonymous_namespace)::Flower::LocationInfo>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_68 = this;
      if ((long)pLVar3 - (long)pLVar16 == 0x7fffffffffffffe0) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar18 = 1;
      if (pLVar3 != pLVar16) {
        uVar18 = uVar15;
      }
      lVar17 = uVar18 + uVar15;
      local_40 = pLVar16;
      if (lVar17 == 0) {
        local_38 = (pointer)0x0;
      }
      else {
        local_38 = (pointer)operator_new(lVar17 * 0x60);
      }
      *(undefined8 *)
       ((long)&(local_38->location).
               super__Variant_base<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
               .
               super__Move_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
       + lVar13 * 0x20 + 0x20) =
           *(undefined8 *)
            &(location->
             super__Variant_base<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
             ).
             super__Move_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
             .
             super__Copy_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
             .
             super__Move_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
             .
             super__Copy_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
             .
             super__Variant_storage_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
             ._M_index;
      uVar5 = *(undefined8 *)
               &(location->
                super__Variant_base<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                ).
                super__Move_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                .
                super__Copy_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                .
                super__Move_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                .
                super__Copy_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                .
                super__Variant_storage_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                ._M_u;
      uVar6 = *(undefined8 *)
               ((long)&(location->
                       super__Variant_base<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                       ).
                       super__Move_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                       .
                       super__Copy_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                       .
                       super__Move_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                       .
                       super__Copy_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                       .
                       super__Variant_storage_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                       ._M_u + 8);
      uVar7 = *(undefined8 *)
               ((long)&(location->
                       super__Variant_base<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                       ).
                       super__Move_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                       .
                       super__Copy_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                       .
                       super__Move_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                       .
                       super__Copy_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                       .
                       super__Variant_storage_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                       ._M_u + 0x18);
      puVar2 = (undefined8 *)
               ((long)&(local_38->location).
                       super__Variant_base<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                       .
                       super__Move_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
               + lVar13 * 0x20 + 0x10);
      *puVar2 = *(undefined8 *)
                 ((long)&(location->
                         super__Variant_base<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                         ).
                         super__Move_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                         .
                         super__Copy_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                         .
                         super__Move_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                         .
                         super__Copy_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                         .
                         super__Variant_storage_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                         ._M_u + 0x10);
      puVar2[1] = uVar7;
      puVar2 = (undefined8 *)
               ((long)&(local_38->location).
                       super__Variant_base<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                       .
                       super__Move_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
               + lVar13 * 0x20);
      *puVar2 = uVar5;
      puVar2[1] = uVar6;
      *(__index_type *)
       ((long)&(&local_38->contents)[lVar13].value.
               super__Variant_base<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
       + 0x18) = '\0';
      puVar2 = (undefined8 *)((long)&local_38->targets + lVar13 * 0x20);
      *puVar2 = 0;
      puVar2[1] = 0;
      *(undefined8 *)((long)&local_38->targets + lVar13 * 0x20 + 0x10) = 0;
      local_60 = this_00;
      if (pLVar3 == local_40) {
        pLVar16 = local_38 + 1;
      }
      else {
        local_50 = (void *)((long)&(local_38->location).
                                   super__Variant_base<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                                   .
                                   super__Move_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                           + lVar13 * 0x20);
        pLVar10 = local_38;
        pLVar19 = local_40;
        local_58 = location;
        local_48 = lVar17;
        do {
          pLVar16 = pLVar10;
          *(undefined8 *)
           ((long)&(pLVar16->location).
                   super__Variant_base<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                   .
                   super__Move_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
           + 0x20) = *(undefined8 *)
                      ((long)&(pLVar19->location).
                              super__Variant_base<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                              .
                              super__Move_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                              .
                              super__Copy_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                              .
                              super__Move_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                              .
                              super__Copy_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                              .
                              super__Variant_storage_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                      + 0x20);
          uVar5 = *(undefined8 *)
                   &(pLVar19->location).
                    super__Variant_base<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                    .
                    super__Move_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                    .
                    super__Copy_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                    .
                    super__Move_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                    .
                    super__Copy_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                    .
                    super__Variant_storage_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
          ;
          uVar6 = *(undefined8 *)
                   ((long)&(pLVar19->location).
                           super__Variant_base<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                           .
                           super__Move_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                           .
                           super__Copy_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                           .
                           super__Move_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                           .
                           super__Copy_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                           .
                           super__Variant_storage_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                   + 8);
          uVar7 = *(undefined8 *)
                   ((long)&(pLVar19->location).
                           super__Variant_base<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                           .
                           super__Move_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                           .
                           super__Copy_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                           .
                           super__Move_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                           .
                           super__Copy_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                           .
                           super__Variant_storage_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                   + 0x18);
          *(undefined8 *)
           ((long)&(pLVar16->location).
                   super__Variant_base<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                   .
                   super__Move_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
           + 0x10) = *(undefined8 *)
                      ((long)&(pLVar19->location).
                              super__Variant_base<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                              .
                              super__Move_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                              .
                              super__Copy_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                              .
                              super__Move_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                              .
                              super__Copy_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                              .
                              super__Variant_storage_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                      + 0x10);
          *(undefined8 *)
           ((long)&(pLVar16->location).
                   super__Variant_base<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                   .
                   super__Move_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
           + 0x18) = uVar7;
          *(undefined8 *)
           &(pLVar16->location).
            super__Variant_base<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
            .
            super__Move_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
               = uVar5;
          *(undefined8 *)
           ((long)&(pLVar16->location).
                   super__Variant_base<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                   .
                   super__Move_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
           + 8) = uVar6;
          std::__detail::__variant::
          _Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
          ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                             *)&pLVar16->contents,
                            (_Copy_ctor_base<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                             *)&pLVar19->contents);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (&pLVar16->targets,&pLVar19->targets);
          lVar17 = local_48;
          pLVar19 = pLVar19 + 1;
          pLVar14 = local_40;
          pLVar10 = pLVar16 + 1;
        } while (pLVar19 != pLVar3);
        do {
          puVar4 = (pLVar14->targets).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (puVar4 != (pointer)0x0) {
            operator_delete(puVar4,(long)(pLVar14->targets).
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                   (long)puVar4);
          }
          std::__detail::__variant::
          _Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
          ::~_Variant_storage((_Variant_storage<false,_wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
                               *)&pLVar14->contents);
          pLVar14 = pLVar14 + 1;
        } while (pLVar14 != pLVar3);
        pLVar16 = pLVar16 + 2;
        location = local_58;
      }
      pFVar9 = local_68;
      if (local_40 != (pointer)0x0) {
        operator_delete(local_40,(long)(local_68->locations).
                                       super__Vector_base<wasm::(anonymous_namespace)::Flower::LocationInfo,_std::allocator<wasm::(anonymous_namespace)::Flower::LocationInfo>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)local_40);
      }
      (pFVar9->locations).
      super__Vector_base<wasm::(anonymous_namespace)::Flower::LocationInfo,_std::allocator<wasm::(anonymous_namespace)::Flower::LocationInfo>_>
      ._M_impl.super__Vector_impl_data._M_start = local_38;
      (pFVar9->locations).
      super__Vector_base<wasm::(anonymous_namespace)::Flower::LocationInfo,_std::allocator<wasm::(anonymous_namespace)::Flower::LocationInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish = pLVar16;
      (pFVar9->locations).
      super__Vector_base<wasm::(anonymous_namespace)::Flower::LocationInfo,_std::allocator<wasm::(anonymous_namespace)::Flower::LocationInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = local_38 + lVar17;
      this_00 = local_60;
    }
    else {
      uVar5 = *(undefined8 *)
               &(location->
                super__Variant_base<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                ).
                super__Move_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                .
                super__Copy_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                .
                super__Move_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                .
                super__Copy_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                .
                super__Variant_storage_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                ._M_u;
      uVar6 = *(undefined8 *)
               ((long)&(location->
                       super__Variant_base<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                       ).
                       super__Move_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                       .
                       super__Copy_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                       .
                       super__Move_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                       .
                       super__Copy_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                       .
                       super__Variant_storage_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                       ._M_u + 8);
      uVar7 = *(undefined8 *)
               ((long)&(location->
                       super__Variant_base<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                       ).
                       super__Move_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                       .
                       super__Copy_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                       .
                       super__Move_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                       .
                       super__Copy_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                       .
                       super__Variant_storage_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                       ._M_u + 0x10);
      uVar8 = *(undefined8 *)
               ((long)&(location->
                       super__Variant_base<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                       ).
                       super__Move_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                       .
                       super__Copy_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                       .
                       super__Move_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                       .
                       super__Copy_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                       .
                       super__Variant_storage_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                       ._M_u + 0x18);
      *(undefined8 *)
       ((long)&(pLVar3->location).
               super__Variant_base<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
               .
               super__Move_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
               .
               super__Copy_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
               .
               super__Move_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
               .
               super__Copy_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
               .
               super__Variant_storage_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
       + 0x20) = *(undefined8 *)
                  &(location->
                   super__Variant_base<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                   ).
                   super__Move_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                   .
                   super__Copy_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                   .
                   super__Move_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                   .
                   super__Copy_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                   .
                   super__Variant_storage_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                   ._M_index;
      *(undefined8 *)
       ((long)&(pLVar3->location).
               super__Variant_base<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
               .
               super__Move_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
               .
               super__Copy_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
               .
               super__Move_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
               .
               super__Copy_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
               .
               super__Variant_storage_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
       + 0x10) = uVar7;
      *(undefined8 *)
       ((long)&(pLVar3->location).
               super__Variant_base<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
               .
               super__Move_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
               .
               super__Copy_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
               .
               super__Move_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
               .
               super__Copy_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
               .
               super__Variant_storage_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
       + 0x18) = uVar8;
      *(undefined8 *)
       &(pLVar3->location).
        super__Variant_base<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
        .
        super__Move_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
        .
        super__Copy_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
        .
        super__Move_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
        .
        super__Copy_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
        .
        super__Variant_storage_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
           = uVar5;
      *(undefined8 *)
       ((long)&(pLVar3->location).
               super__Variant_base<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
               .
               super__Move_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
               .
               super__Copy_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
               .
               super__Move_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
               .
               super__Copy_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
               .
               super__Variant_storage_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
       + 8) = uVar6;
      *(__index_type *)
       ((long)&(pLVar3->contents).value.
               super__Variant_base<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
               .
               super__Move_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
               .
               super__Copy_assign_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
               .
               super__Move_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
               .
               super__Copy_ctor_alias<wasm::PossibleContents::None,_wasm::Literal,_wasm::PossibleContents::GlobalInfo,_wasm::PossibleContents::ConeType,_wasm::PossibleContents::Many>
       + 0x18) = '\0';
      (pLVar3->targets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pLVar3->targets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pLVar3->targets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ppLVar1 = &(this->locations).
                 super__Vector_base<wasm::(anonymous_namespace)::Flower::LocationInfo,_std::allocator<wasm::(anonymous_namespace)::Flower::LocationInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppLVar1 = *ppLVar1 + 1;
    }
    pmVar12 = std::__detail::
              _Map_base<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_std::pair<const_std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_unsigned_int>,_std::allocator<std::pair<const_std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>_>,_std::hash<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[](this_00,location);
    *pmVar12 = (mapped_type)uVar15;
  }
  else {
    uVar15 = (ulong)*(uint *)((long)iVar11.
                                    super__Node_iterator_base<std::pair<const_std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>,_unsigned_int>,_true>
                                    ._M_cur + 0x30);
  }
  return (LocationIndex)uVar15;
}

Assistant:

LocationIndex getIndex(const Location& location) {
    auto iter = locationIndexes.find(location);
    if (iter != locationIndexes.end()) {
      return iter->second;
    }

    // Allocate a new index here.
    size_t index = locations.size();
#if defined(POSSIBLE_CONTENTS_DEBUG) && POSSIBLE_CONTENTS_DEBUG >= 2
    std::cout << "  new index " << index << " for ";
    dump(location);
#endif
    if (index >= std::numeric_limits<LocationIndex>::max()) {
      // 32 bits should be enough since each location takes at least one byte
      // in the binary, and we don't have 4GB wasm binaries yet... do we?
      Fatal() << "Too many locations for 32 bits";
    }
    locations.emplace_back(location);
    locationIndexes[location] = index;

    return index;
  }